

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSExporter.cpp
# Opt level: O3

string * __thiscall
Assimp::(anonymous_namespace)::GetMeshName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,aiMesh *mesh,uint index,
          aiNode *node)

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  int iVar4;
  long *plVar5;
  string *extraout_RAX;
  string *psVar6;
  uint uVar7;
  undefined4 in_register_0000000c;
  size_type *psVar8;
  ulong uVar9;
  char *pcVar10;
  bool bVar11;
  bool bVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  char postfix [10];
  string result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char local_50 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar9 = (ulong)mesh & 0xffffffff;
  if ((GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::underscore_abi_cxx11_ ==
       '\0') && (iVar4 = __cxa_guard_acquire(), iVar4 != 0)) {
    GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::underscore_abi_cxx11_.
    _M_dataplus._M_p =
         (pointer)&GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                   underscore_abi_cxx11_.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                underscore_abi_cxx11_,"_","");
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                  underscore_abi_cxx11_,&__dso_handle);
    __cxa_guard_release();
  }
  local_50[8] = '\0';
  local_50[9] = '\0';
  local_50[0] = '\0';
  local_50[1] = '\0';
  local_50[2] = '\0';
  local_50[3] = '\0';
  local_50[4] = '\0';
  local_50[5] = '\0';
  local_50[6] = '\0';
  local_50[7] = '\0';
  if ((int)mesh < 0) {
    pcVar10 = local_50 + 1;
    local_50[0] = '-';
    local_50[1] = '\0';
    local_50[2] = '\0';
    local_50[3] = '\0';
    local_50[4] = '\0';
    local_50[5] = '\0';
    local_50[6] = '\0';
    local_50[7] = '\0';
    uVar9 = (ulong)(uint)-(int)mesh;
    uVar7 = 2;
  }
  else {
    uVar7 = 1;
    pcVar10 = local_50;
  }
  iVar4 = 1000000000;
  bVar3 = 0;
  do {
    lVar2 = (long)(int)uVar9 / (long)iVar4;
    bVar11 = (int)lVar2 != 0;
    bVar12 = iVar4 == 1;
    if ((bool)(bVar3 | bVar12 | bVar11)) {
      pcVar1 = pcVar10 + 1;
      *pcVar10 = (char)lVar2 + '0';
      pcVar10 = pcVar1;
      if (iVar4 == 1) break;
      uVar7 = uVar7 + 1;
      uVar9 = (long)(int)uVar9 % (long)iVar4 & 0xffffffff;
    }
    iVar4 = iVar4 / 10;
    bVar3 = bVar3 | bVar12 | bVar11;
  } while (uVar7 < 10);
  *pcVar10 = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,(char *)(CONCAT44(in_register_0000000c,index) + 4),
             (allocator<char> *)&local_70);
  if (*(int *)(this + 0xec) != 0) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,
               GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
               underscore_abi_cxx11_._M_dataplus._M_p,
               GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
               underscore_abi_cxx11_._M_dataplus._M_p +
               GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
               underscore_abi_cxx11_._M_string_length);
    std::__cxx11::string::append((char *)&local_70);
    std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_70,&local_40,
                 &GetMeshName[abi:cxx11](aiMesh_const&,unsigned_int,aiNode_const&)::
                  underscore_abi_cxx11_);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    lVar2 = plVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
  }
  __return_storage_ptr__->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  psVar6 = (string *)&local_40.field_2;
  if ((string *)local_40._M_dataplus._M_p != psVar6) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    psVar6 = extraout_RAX;
  }
  return psVar6;
}

Assistant:

std::string GetMeshName(const aiMesh& mesh, unsigned int index, const aiNode& node) {
        static const std::string underscore = "_";
        char postfix[10] = {0};
        ASSIMP_itoa10(postfix, index);

        std::string result = node.mName.C_Str();
        if (mesh.mName.length > 0) {
            result += underscore + mesh.mName.C_Str();
        }
        return result + underscore + postfix;
    }